

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrEOR0x4d(CPU *this)

{
  byte bVar1;
  Memory *this_00;
  byte bVar2;
  uint16_t uVar3;
  byte bVar4;
  
  this_00 = this->m;
  uVar3 = this->PC;
  this->PC = uVar3 + 2;
  uVar3 = Memory::Read16(this_00,uVar3);
  bVar2 = Memory::Read8(this_00,uVar3);
  bVar1 = this->A;
  bVar4 = bVar1 ^ bVar2;
  this->A = bVar4;
  this->field_0x2e = bVar4 >> 7 | (bVar1 == bVar2) << 6 | this->field_0x2e & 0xbe;
  return 4;
}

Assistant:

int CPU::instrEOR0x4d() {
	EOR(absolute_addr());
	return 4;
}